

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<char,_std::allocator<char>_> *
mxx::gatherv<char>(vector<char,_std::allocator<char>_> *__return_storage_ptr__,char *data,
                  size_t size,vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
                  int root,comm *comm)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  ulong __new_size;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __new_size = 0;
  if (puVar2 != puVar1) {
    do {
      uVar3 = (int)__new_size + (int)*puVar2;
      __new_size = (ulong)uVar3;
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
    __new_size = (ulong)(int)uVar3;
  }
  if (comm->m_rank == root) {
    std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,__new_size);
  }
  gatherv<char>(data,size,
                (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start,recv_sizes,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    if (comm.rank() == root)
        result.resize(total_size);
    gatherv(data, size, &result[0], recv_sizes, root, comm);
    return result;
}